

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::Members::~Members(Members *this)

{
  Buffer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar1;
  pointer ppPVar2;
  pointer pNVar3;
  pointer pOVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  if (((FILE *)this->file != (FILE *)0x0) && (this->close_file == true)) {
    fclose((FILE *)this->file);
  }
  this_00 = this->output_buffer;
  if (this_00 != (Buffer *)0x0) {
    Buffer::~Buffer(this_00);
  }
  operator_delete(this_00,8);
  this_01 = (this->progress_reporter).
            super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pcVar1 = (this->lin_pass1_filename)._M_dataplus._M_p;
  paVar5 = &(this->lin_pass1_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->deterministic_id_data)._M_dataplus._M_p;
  paVar5 = &(this->deterministic_id_data).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->count_buffer)._M_dataplus._M_p;
  paVar5 = &(this->count_buffer).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  ppPVar2 = (this->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2,(long)(this->pipeline_stack).
                                  super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar2)
    ;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
  ::~_Rb_tree(&(this->object_stream_to_objects)._M_t);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::~_Rb_tree(&(this->contents_to_page_seq)._M_t);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::~_Rb_tree(&(this->page_object_to_seq)._M_t);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&(this->normalized_streams)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_QPDFWriter::NewObject>,_std::_Select1st<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>_>
  ::~_Rb_tree(&(this->new_obj).super_ObjTable<QPDFWriter::NewObject>.sparse_elements._M_t);
  pNVar3 = (this->new_obj).super_ObjTable<QPDFWriter::NewObject>.
           super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
           super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pNVar3 != (pointer)0x0) {
    operator_delete(pNVar3,(long)(this->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                 super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                 .
                                 super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pNVar3);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_QPDFWriter::Object>,_std::_Select1st<std::pair<const_unsigned_long,_QPDFWriter::Object>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>_>
  ::~_Rb_tree(&(this->obj).super_ObjTable<QPDFWriter::Object>.sparse_elements._M_t);
  pOVar4 = (this->obj).super_ObjTable<QPDFWriter::Object>.
           super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pOVar4 != (pointer)0x0) {
    operator_delete(pOVar4,(long)(this->obj).super_ObjTable<QPDFWriter::Object>.
                                 super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                 .
                                 super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pOVar4);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->object_queue);
  std::__cxx11::_List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
  _M_clear(&(this->to_delete).
            super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>
          );
  pcVar1 = (this->cur_data_key)._M_dataplus._M_p;
  paVar5 = &(this->cur_data_key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->extra_header_text)._M_dataplus._M_p;
  paVar5 = &(this->extra_header_text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->forced_pdf_version)._M_dataplus._M_p;
  paVar5 = &(this->forced_pdf_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->min_pdf_version)._M_dataplus._M_p;
  paVar5 = &(this->min_pdf_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->final_pdf_version)._M_dataplus._M_p;
  paVar5 = &(this->final_pdf_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->id2)._M_dataplus._M_p;
  paVar5 = &(this->id2).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->id1)._M_dataplus._M_p;
  paVar5 = &(this->id1).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->encryption_dictionary)._M_t);
  pcVar1 = (this->encryption_key)._M_dataplus._M_p;
  paVar5 = &(this->encryption_key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

QPDFWriter::Members::~Members()
{
    if (file && close_file) {
        fclose(file);
    }
    delete output_buffer;
}